

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# err.cc
# Opt level: O2

void err_copy(err_error_st *dst,err_error_st *src)

{
  char *pcVar1;
  
  err_clear(dst);
  dst->file = src->file;
  if (src->data != (char *)0x0) {
    pcVar1 = strdup_libc_malloc(src->data);
    dst->data = pcVar1;
  }
  dst->packed = src->packed;
  dst->line = src->line;
  return;
}

Assistant:

static void err_copy(struct err_error_st *dst, const struct err_error_st *src) {
  err_clear(dst);
  dst->file = src->file;
  if (src->data != NULL) {
    // We can't use OPENSSL_strdup because we don't want to call OPENSSL_malloc,
    // which can affect the error stack.
    dst->data = strdup_libc_malloc(src->data);
  }
  dst->packed = src->packed;
  dst->line = src->line;
}